

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ATN.hpp
# Opt level: O2

void __thiscall
Centaurus::ATNNode<char>::print(ATNNode<char> *this,wostream *os,int index,wstring *prefix)

{
  wostream *pwVar1;
  wchar_t *pwVar2;
  
  switch(this->m_type) {
  case Blank:
    pwVar1 = std::operator<<(os,(wstring *)prefix);
    pwVar2 = L" [ label=\"\", xlabel=\"[";
    break;
  case Nonterminal:
    pwVar1 = std::operator<<(os,(wstring *)prefix);
    pwVar1 = std::operator<<(pwVar1,L" [ label=\"");
    pwVar1 = std::operator<<(pwVar1,(wstring *)&(this->m_invoke).m_id);
    pwVar1 = std::operator<<(pwVar1,L"\", xlabel=\"[");
    pwVar1 = (wostream *)std::wostream::operator<<((wostream *)pwVar1,index);
    pwVar1 = std::operator<<(pwVar1,"]\" ];");
    goto LAB_001107aa;
  case LiteralTerminal:
    pwVar1 = std::operator<<(os,(wstring *)prefix);
    pwVar1 = std::operator<<(pwVar1,L" [ label=\"\\\"\\\"");
    pwVar2 = L"\", xlabel=\"[";
    break;
  case RegularTerminal:
    NFABase<Centaurus::NFABaseState<char,_int>_>::print_subgraph
              (&(this->m_nfa).super_NFABase<Centaurus::NFABaseState<char,_int>_>,os,index,prefix);
    return;
  case WhiteSpace:
    pwVar1 = std::operator<<(os,(wstring *)prefix);
    pwVar2 = L" [ label=\"[ ]\", xlabel=\"[";
    break;
  default:
    return;
  }
  pwVar1 = std::operator<<(pwVar1,pwVar2);
  pwVar1 = (wostream *)std::wostream::operator<<((wostream *)pwVar1,index);
  pwVar1 = std::operator<<(pwVar1,L"]\" ];");
LAB_001107aa:
  std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar1);
  return;
}

Assistant:

void print(std::wostream& os, int index, const std::wstring& prefix) const
	{
		switch (m_type)
		{
		case ATNNodeType::Blank:
			os << prefix << L" [ label=\"\", xlabel=\"[" << index << L"]\" ];" << std::endl;
			break;
		case ATNNodeType::Nonterminal:
			os << prefix << L" [ label=\"" << m_invoke << L"\", xlabel=\"[" << index << "]\" ];" << std::endl;
			break;
		case ATNNodeType::LiteralTerminal:
			os << prefix << L" [ label=\"\\\"\\\"" << /*m_literal <<*/ L"\", xlabel=\"[" << index << L"]\" ];" << std::endl;
			break;
		case ATNNodeType::RegularTerminal:
			m_nfa.print_subgraph(os, index, prefix);
			break;
		case ATNNodeType::WhiteSpace:
			os << prefix << L" [ label=\"[ ]\", xlabel=\"[" << index << L"]\" ];" << std::endl;
			break;
		}
	}